

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_0::CheckIncompleteResult<vk::VkExtensionProperties>::operator()
          (CheckIncompleteResult<vk::VkExtensionProperties> *this,Context *context,
          ResultCollector *results,size_t expectedCompleteSize)

{
  undefined1 auVar1 [16];
  ResultCollector *this_00;
  pointer pVVar2;
  pointer pVVar3;
  bool bVar4;
  pointer __s;
  deUint32 dVar5;
  allocator<char> local_71;
  ResultCollector *local_70;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> outputData;
  string local_50;
  
  if (expectedCompleteSize != 0) {
    local_70 = results;
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::vector
              (&outputData,expectedCompleteSize,(allocator_type *)&local_50);
    pVVar3 = outputData.
             super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = outputData.
             super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = expectedCompleteSize;
    for (__s = outputData.
               super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
               ._M_impl.super__Vector_impl_data._M_start; __s < pVVar3; __s = __s + 1) {
      memset(__s,0xde,0x104);
    }
    dVar5 = SUB164(auVar1 / ZEXT816(3),0);
    this->m_count = dVar5;
    this->m_result = VK_SUCCESS;
    (*this->_vptr_CheckIncompleteResult[2])(this,context,pVVar2);
    this_00 = local_70;
    if (((this->m_count != dVar5) || (this->m_result != VK_INCOMPLETE)) ||
       (bVar4 = ::vk::ValidateQueryBits::
                checkBits<__gnu_cxx::__normal_iterator<vk::VkExtensionProperties*,std::vector<vk::VkExtensionProperties,std::allocator<vk::VkExtensionProperties>>>>
                          (outputData.
                           super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           (SUB168(auVar1 / ZEXT816(3),0) & 0xffffffff),
                           (__normal_iterator<vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
                            )outputData.
                             super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                             ._M_impl.super__Vector_impl_data._M_finish,0xde), !bVar4)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Query didn\'t return VK_INCOMPLETE",&local_71);
      tcu::ResultCollector::fail(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
    ~_Vector_base(&outputData.
                   super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                 );
    return;
  }
  return;
}

Assistant:

void operator() (Context& context, tcu::ResultCollector& results, const std::size_t expectedCompleteSize)
	{
		if (expectedCompleteSize == 0)
			return;

		vector<T>		outputData	(expectedCompleteSize);
		const deUint32	usedSize	= static_cast<deUint32>(expectedCompleteSize / 3);

		ValidateQueryBits::fillBits(outputData.begin(), outputData.end());	// unused entries should have this pattern intact
		m_count		= usedSize;
		m_result	= VK_SUCCESS;

		getResult(context, &outputData[0]);									// update m_count and m_result

		if (m_count != usedSize || m_result != VK_INCOMPLETE || !ValidateQueryBits::checkBits(outputData.begin() + m_count, outputData.end()))
			results.fail("Query didn't return VK_INCOMPLETE");
	}